

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_log10f.h
# Opt level: O2

vector<Result<float,_double>,_std::allocator<Result<float,_double>_>_> * __thiscall
Log10Test::runTests(vector<Result<float,_double>,_std::allocator<Result<float,_double>_>_>
                    *__return_storage_ptr__,Log10Test *this)

{
  allocator<char> local_172;
  allocator<char> local_171;
  string local_170;
  string local_150;
  Result<float,_double> local_130;
  
  (__return_storage_ptr__->
  super__Vector_base<Result<float,_double>,_std::allocator<Result<float,_double>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Result<float,_double>,_std::allocator<Result<float,_double>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Result<float,_double>,_std::allocator<Result<float,_double>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"#0",&local_171);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"std::log10f",&local_172);
  Test<float,float,double>::run<float(*)(float)>
            (&local_130,(Test<float,float,double> *)this,&local_150,&local_170,log10f_0);
  std::vector<Result<float,double>,std::allocator<Result<float,double>>>::
  emplace_back<Result<float,double>>
            ((vector<Result<float,double>,std::allocator<Result<float,double>>> *)
             __return_storage_ptr__,&local_130);
  Result<float,_double>::~Result(&local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"#1",&local_171);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"log2(x) / log2(10)",&local_172);
  Test<float,float,double>::run<float(*)(float)>
            (&local_130,(Test<float,float,double> *)this,&local_150,&local_170,log10f_1);
  std::vector<Result<float,double>,std::allocator<Result<float,double>>>::
  emplace_back<Result<float,double>>
            ((vector<Result<float,double>,std::allocator<Result<float,double>>> *)
             __return_storage_ptr__,&local_130);
  Result<float,_double>::~Result(&local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"#2",&local_171);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"ARM forum / Dr. Paul Beckmann",&local_172);
  Test<float,float,double>::run<float(*)(float)>
            (&local_130,(Test<float,float,double> *)this,&local_150,&local_170,log10f_2);
  std::vector<Result<float,double>,std::allocator<Result<float,double>>>::
  emplace_back<Result<float,double>>
            ((vector<Result<float,double>,std::allocator<Result<float,double>>> *)
             __return_storage_ptr__,&local_130);
  Result<float,_double>::~Result(&local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"#3",&local_171);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"David Goldberg div",&local_172);
  Test<float,float,double>::run<float(*)(float)>
            (&local_130,(Test<float,float,double> *)this,&local_150,&local_170,log10f_3);
  std::vector<Result<float,double>,std::allocator<Result<float,double>>>::
  emplace_back<Result<float,double>>
            ((vector<Result<float,double>,std::allocator<Result<float,double>>> *)
             __return_storage_ptr__,&local_130);
  Result<float,_double>::~Result(&local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"#4",&local_171);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"David Goldberg mul",&local_172);
  Test<float,float,double>::run<float(*)(float)>
            (&local_130,(Test<float,float,double> *)this,&local_150,&local_170,log10f_4);
  std::vector<Result<float,double>,std::allocator<Result<float,double>>>::
  emplace_back<Result<float,double>>
            ((vector<Result<float,double>,std::allocator<Result<float,double>>> *)
             __return_storage_ptr__,&local_130);
  Result<float,_double>::~Result(&local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Result<input_t, storage_t>> runTests() const
    {
        std::vector<Result<input_t, storage_t>> results;
        results.push_back(run("#0", "std::log10f", &log10f_0));
        results.push_back(run("#1", "log2(x) / log2(10)", &log10f_1));
        results.push_back(run("#2", "ARM forum / Dr. Paul Beckmann", &log10f_2));
        results.push_back(run("#3", "David Goldberg div", &log10f_3));
        results.push_back(run("#4", "David Goldberg mul", &log10f_4));
        return results;
    }